

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O1

Json __thiscall JFSON::Json::parse(Json *this,string *in,string *err,JsonParse strategy)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Json JVar7;
  Json result;
  char buf [12];
  JsonParser parser;
  JsonParser local_a0;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  undefined1 local_40 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  local_40._8_8_ = 0;
  local_40[0x18] = false;
  local_40._0_8_ = in;
  local_40._16_8_ = err;
  local_40._28_4_ = strategy;
  anon_unknown_22::JsonParser::parse_json(&local_a0,(int)(JsonParser *)local_40);
  anon_unknown_22::JsonParser::consume_garbage((JsonParser *)local_40);
  sVar1 = local_a0.i;
  if ((bool)local_40[0x18] == true) {
    Json(this);
    _Var6._M_pi = extraout_RDX_00;
  }
  else if (local_40._8_8_ == in->_M_string_length) {
    (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_a0.str;
    (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0.i = 0;
    (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
    local_a0.str = (string *)0x0;
    _Var6._M_pi = extraout_RDX;
  }
  else {
    uVar4 = (uint)(in->_M_dataplus)._M_p[local_40._8_8_];
    if ((int)uVar4 < 0x20) {
      snprintf((char *)((long)&local_a0.err + 4),0xc,"(%d)");
    }
    else {
      snprintf((char *)((long)&local_a0.err + 4),0xc,"\'%c\' (%d)",(ulong)uVar4,(ulong)uVar4);
    }
    __s = (char *)((long)&local_a0.err + 4);
    local_80[0] = local_70;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,__s,(long)local_80 + (sVar2 - 0xc));
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_80,0,(char *)0x0,0x10930e);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_50 = *plVar5;
      lStack_48 = plVar3[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar5;
      local_60 = (long *)*plVar3;
    }
    local_58 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    JVar7 = anon_unknown_22::JsonParser::fail((JsonParser *)this,(string *)local_40);
    _Var6._M_pi = JVar7.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_60 != &local_50) {
      operator_delete(local_60);
      _Var6._M_pi = extraout_RDX_01;
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0]);
      _Var6._M_pi = extraout_RDX_02;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.i !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.i);
    _Var6._M_pi = extraout_RDX_03;
  }
  JVar7.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  JVar7.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar7.m_ptr.super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json Json::parse(const string &in, string &err, JsonParse strategy) {
    JsonParser parser { in, 0, err, false, strategy };
    Json result = parser.parse_json(0);

    // Check for any trailing garbage
    parser.consume_garbage();
    if (parser.failed)
        return Json();
    if (parser.i != in.size())
        return parser.fail("unexpected trailing " + esc(in[parser.i]));

    return result;
}